

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true> __thiscall
duckdb::LateMaterialization::ConstructLHS(LateMaterialization *this,LogicalGet *get)

{
  pointer pFVar1;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *__x;
  pointer pLVar2;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *this_00;
  LogicalGet *in_RDX;
  pointer *__ptr;
  idx_t table_index;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_38;
  idx_t local_30;
  
  local_30 = Binder::GenerateTableIndex
                       (*(Binder **)
                         &(((get->super_LogicalOperator).types.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start)->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>);
  pFVar1 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&in_RDX->bind_data);
  (*pFVar1->_vptr_FunctionData[2])(&local_38,pFVar1);
  make_uniq<duckdb::LogicalGet,unsigned_long&,duckdb::TableFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<std::__cxx11::string,true>&,std::unordered_map<unsigned_long,duckdb::TableColumn,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>>&>
            ((duckdb *)this,&local_30,&in_RDX->function,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             &local_38,&in_RDX->returned_types,&in_RDX->names,&in_RDX->virtual_columns);
  if (local_38._M_head_impl != (FunctionData *)0x0) {
    (*(local_38._M_head_impl)->_vptr_FunctionData[1])();
  }
  __x = &LogicalGet::GetColumnIds(in_RDX)->
         super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>;
  pLVar2 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
                     ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                       *)this);
  this_00 = &LogicalGet::GetMutableColumnIds(pLVar2)->
             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>;
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::operator=(this_00,__x);
  pLVar2 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::operator->
                     ((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                       *)this);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pLVar2->projection_ids,
             &(in_RDX->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  return (unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>)
         (unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>_>)this;
}

Assistant:

unique_ptr<LogicalGet> LateMaterialization::ConstructLHS(LogicalGet &get) {
	// we need to construct a new scan of the same table
	auto table_index = optimizer.binder.GenerateTableIndex();
	auto new_get = make_uniq<LogicalGet>(table_index, get.function, get.bind_data->Copy(), get.returned_types,
	                                     get.names, get.virtual_columns);
	new_get->GetMutableColumnIds() = get.GetColumnIds();
	new_get->projection_ids = get.projection_ids;
	return new_get;
}